

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwDefaultWindowHints(void)

{
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    memset(&_glfw,0,0x98);
    _glfw.hints.context.api = 0x30001;
    _glfw.hints.context.major = 1;
    _glfw.hints.context.minor = 0;
    _glfw.hints.window.resizable = '\x01';
    _glfw.hints.window.visible = '\x01';
    _glfw.hints.window.decorated = '\x01';
    _glfw.hints.window.focused = '\x01';
    _glfw.hints.window.autoIconify = '\x01';
    _glfw.hints.framebuffer.redBits = 8;
    _glfw.hints.framebuffer.greenBits = 8;
    _glfw.hints.framebuffer.blueBits = 8;
    _glfw.hints.framebuffer.alphaBits = 8;
    _glfw.hints.framebuffer.depthBits = 0x18;
    _glfw.hints.framebuffer.stencilBits = 8;
    _glfw.hints.framebuffer.doublebuffer = 1;
    _glfw.hints.refreshRate = -1;
  }
  return;
}

Assistant:

void glfwDefaultWindowHints(void)
{
    _GLFW_REQUIRE_INIT();

    memset(&_glfw.hints, 0, sizeof(_glfw.hints));

    // The default is OpenGL with minimum version 1.0
    _glfw.hints.context.api   = GLFW_OPENGL_API;
    _glfw.hints.context.major = 1;
    _glfw.hints.context.minor = 0;

    // The default is a focused, visible, resizable window with decorations
    _glfw.hints.window.resizable   = GL_TRUE;
    _glfw.hints.window.visible     = GL_TRUE;
    _glfw.hints.window.decorated   = GL_TRUE;
    _glfw.hints.window.focused     = GL_TRUE;
    _glfw.hints.window.autoIconify = GL_TRUE;

    // The default is 24 bits of color, 24 bits of depth and 8 bits of stencil,
    // double buffered
    _glfw.hints.framebuffer.redBits      = 8;
    _glfw.hints.framebuffer.greenBits    = 8;
    _glfw.hints.framebuffer.blueBits     = 8;
    _glfw.hints.framebuffer.alphaBits    = 8;
    _glfw.hints.framebuffer.depthBits    = 24;
    _glfw.hints.framebuffer.stencilBits  = 8;
    _glfw.hints.framebuffer.doublebuffer = GL_TRUE;

    // The default is to select the highest available refresh rate
    _glfw.hints.refreshRate = GLFW_DONT_CARE;
}